

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::AsyncInputStream::pumpTo(AsyncInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar1;
  uint64_t in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar2;
  NullableValue<kj::Promise<unsigned_long>_> _result146;
  NullableValue<kj::Promise<unsigned_long>_> local_50;
  NullableValue<kj::Promise<unsigned_long>_> local_40;
  
  (**(code **)(*(long *)amount + 0x10))(&local_50,amount,output);
  aVar1 = local_50.field_1;
  local_40.isSet = local_50.isSet;
  aVar2 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2)&local_50;
  if (local_50.isSet == true) {
    local_40.field_1 = local_50.field_1;
    local_50.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2)0x0
    ;
    aVar2 = aVar1;
  }
  kj::_::NullableValue<kj::Promise<unsigned_long>_>::~NullableValue(&local_50);
  if (local_50.isSet == false) {
    kj::_::NullableValue<kj::Promise<unsigned_long>_>::~NullableValue(&local_40);
    unoptimizedPumpTo((kj *)this,(AsyncInputStream *)output,(AsyncOutputStream *)amount,in_RCX,0);
  }
  else {
    this->_vptr_AsyncInputStream = (_func_int **)aVar2;
    local_40.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2)0x0
    ;
    kj::_::NullableValue<kj::Promise<unsigned_long>_>::~NullableValue(&local_40);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> AsyncInputStream::pumpTo(
    AsyncOutputStream& output, uint64_t amount) {
  // See if output wants to dispatch on us.
  KJ_IF_SOME(result, output.tryPumpFrom(*this, amount)) {
    return kj::mv(result);
  }

  // OK, fall back to naive approach.
  return unoptimizedPumpTo(*this, output, amount);
}